

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_fill_extcomplex_module
              (ly_ctx *ctx,lys_ext_instance_complex *ext,char *parent_name,char **values,
              int implemented)

{
  long *plVar1;
  long lVar2;
  char **ppcVar3;
  long *plVar4;
  long *plVar5;
  lys_module *plVar6;
  LY_ERR *pLVar7;
  ulong uVar8;
  LY_ECODE code;
  uint uVar9;
  int iVar10;
  long lVar11;
  lyext_substmt *local_58;
  lyext_substmt *info;
  char **local_48;
  char *local_40;
  int local_34;
  
  iVar10 = 0;
  if (values != (char **)0x0) {
    info = (lyext_substmt *)ctx;
    local_34 = implemented;
    plVar4 = (long *)lys_ext_complex_get_substmt(LY_STMT_MODULE,ext,&local_58);
    if (plVar4 == (long *)0x0) {
      code = LYE_INCHILDSTMT;
LAB_00153c78:
      ly_vlog(code,LY_VLOG_NONE,(void *)0x0,"module",parent_name);
LAB_00153c7f:
      iVar10 = 1;
    }
    else {
      iVar10 = 0;
      if (*values != (char *)0x0) {
        lVar11 = 0;
        plVar5 = plVar4;
        local_48 = values;
        local_40 = parent_name;
        do {
          if ((local_58->cardinality < LY_STMT_CARD_SOME) && (*plVar5 != 0)) {
            code = LYE_TOOMANY;
            parent_name = local_40;
            goto LAB_00153c78;
          }
          uVar9 = 0;
          if (LY_STMT_CARD_MAND < local_58->cardinality) {
            plVar5 = (long *)*plVar4;
            uVar9 = 0;
            if (plVar5 == (long *)0x0) {
              plVar5 = (long *)calloc(2,8);
              *plVar4 = (long)plVar5;
            }
            else if (*plVar5 != 0) {
              uVar9 = 0;
              do {
                uVar9 = uVar9 + 1;
                plVar1 = plVar5 + 1;
                plVar5 = plVar5 + 1;
              } while (*plVar1 != 0);
            }
          }
          ppcVar3 = local_48;
          uVar8 = (ulong)uVar9;
          if (uVar9 != 0) {
            plVar5 = (long *)realloc((void *)*plVar4,uVar8 * 8 + 0x10);
            if (plVar5 == (long *)0x0) {
              pLVar7 = ly_errno_location();
              *pLVar7 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_extcomplex_module");
              goto LAB_00153c7f;
            }
            *plVar4 = (long)plVar5;
            plVar5[uVar8 + 1] = 0;
          }
          plVar6 = yang_read_module((ly_ctx *)info,ppcVar3[lVar11],0,(char *)0x0,local_34);
          plVar5[uVar8] = (long)plVar6;
          if (plVar6 == (lys_module *)0x0) goto LAB_00153c7f;
          lVar2 = lVar11 + 1;
          lVar11 = lVar11 + 1;
        } while (ppcVar3[lVar2] != (char *)0x0);
        iVar10 = 0;
      }
    }
  }
  return iVar10;
}

Assistant:

int
yang_fill_extcomplex_module(struct ly_ctx *ctx, struct lys_ext_instance_complex *ext,
                            char *parent_name, char **values, int implemented)
{
    int c, i;
    struct lys_module **modules, ***p, *reallocated, **pp;
    struct lyext_substmt *info;

    if (!values) {
        return EXIT_SUCCESS;
    }
    pp = modules = lys_ext_complex_get_substmt(LY_STMT_MODULE, ext, &info);
    if (!modules) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "module", parent_name);
        return EXIT_FAILURE;
    }

    for (i = 0; values[i]; ++i) {
        c = 0;
        if (info->cardinality < LY_STMT_CARD_SOME && *modules) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "module", parent_name);
            return EXIT_FAILURE;
        }
        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, so instead of pointer to array,
             * we have in modules pointer to pointer to array */
            p = (struct lys_module ***)pp;
            modules = *p;
            if (!modules) {
                /* allocate initial array */
                *p = modules = calloc(2, sizeof(struct lys_module *));
            } else {
                for (c = 0; *modules; modules++, c++);
            }
        }

        if (c) {
            /* enlarge the array */
            reallocated = realloc(*p, (c + 2) * sizeof(struct lys_module *));
            if (!reallocated) {
                LOGMEM;
                return EXIT_FAILURE;
            }
            *p = (struct lys_module **)reallocated;
            modules = *p;
            modules[c + 1] = NULL;
        }

        modules[c] = yang_read_module(ctx, values[i], 0, NULL, implemented);
        if (!modules[c]) {
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}